

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.h
# Opt level: O0

void __thiscall
ProblemFireFightingFactored::~ProblemFireFightingFactored
          (ProblemFireFightingFactored *this,void **vtt)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long *in_RDI;
  void **in_stack_00000008;
  FactoredDecPOMDPDiscrete *in_stack_00000010;
  
  *in_RDI = (long)(in_RSI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x58)) =
       in_RSI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x60)) =
       in_RSI[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x68)) =
       in_RSI[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x70)) =
       in_RSI[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x40)) =
       in_RSI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x50)) =
       in_RSI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x48)) =
       in_RSI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  in_RDI[0xc0] = (long)in_RSI[9].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RSI);
  FactoredDecPOMDPDiscrete::~FactoredDecPOMDPDiscrete(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

virtual ~ProblemFireFightingFactored(){}